

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex2.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  long lVar2;
  bool bVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  allocator<char> local_174;
  allocator_type local_173;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_172;
  allocator<char> local_171;
  Argengine ae;
  Error error;
  _Any_data local_128;
  code *local_118;
  code *local_110;
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  string local_e0 [32];
  string local_c0 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  juzzlin::Argengine::Argengine(&ae,argc,argv,true);
  std::__cxx11::string::string<std::allocator<char>>((string *)&error,"foo",&local_171);
  __l._M_len = 1;
  __l._M_array = (iterator)&error;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_40,__l,&local_172,&local_173);
  local_108._M_unused._M_object = (void *)0x0;
  local_108._8_8_ = 0;
  local_f0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/examples/ex2/ex2.cpp:43:18)>
             ::_M_invoke;
  local_f8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/examples/ex2/ex2.cpp:43:18)>
             ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>(local_c0,"",&local_174);
  juzzlin::Argengine::addOption(&ae,&local_40,&local_108,0,local_c0);
  std::__cxx11::string::~string(local_c0);
  std::_Function_base::~_Function_base((_Function_base *)&local_108);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_40);
  std::__cxx11::string::~string((string *)&error);
  std::__cxx11::string::string<std::allocator<char>>((string *)&error,"bar",&local_171);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&error;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_70,__l_00,&local_172,&local_173);
  local_128._M_unused._M_object = (void *)0x0;
  local_128._8_8_ = 0;
  local_110 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/examples/ex2/ex2.cpp:49:18)>
              ::_M_invoke;
  local_118 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/examples/ex2/ex2.cpp:49:18)>
              ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"",&local_174);
  juzzlin::Argengine::addOption(&ae,&local_70,&local_128,0,local_e0);
  std::__cxx11::string::~string(local_e0);
  std::_Function_base::~_Function_base((_Function_base *)&local_128);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_70);
  std::__cxx11::string::~string((string *)&error);
  std::__cxx11::string::string<std::allocator<char>>((string *)&error,"foo",&local_171);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(error.message.field_2._M_local_buf + 8),"bar",(allocator<char> *)&local_172)
  ;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&error;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_a0,__l_01,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_173,(allocator_type *)&local_174);
  juzzlin::Argengine::addConflictingOptions(&ae,&local_a0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_a0);
  lVar2 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&error.code + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  error.code = Ok;
  error.message._M_dataplus._M_p = (pointer)&error.message.field_2;
  error.message._M_string_length = 0;
  error.message.field_2._M_local_buf[0] = '\0';
  juzzlin::Argengine::parse((Error *)&ae);
  bVar3 = error.code != Ok;
  if (bVar3) {
    poVar1 = std::operator<<((ostream *)&std::cerr,(string *)&error.message);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    juzzlin::Argengine::printHelp();
  }
  std::__cxx11::string::~string((string *)&error.message);
  juzzlin::Argengine::~Argengine(&ae);
  return (uint)bVar3;
}

Assistant:

int main(int argc, char ** argv)
{
    // Instantiate Argengine and give it the raw argument data.
    Argengine ae(argc, argv);

    // Add a minimal dummy option "foo".
    ae.addOption(
      { "foo" }, [] {
          std::cout << "Foo enabled!" << std::endl;
      });

    // Add a minimal dummy option "bar".
    ae.addOption(
      { "bar" }, [] {
          std::cout << "Bar enabled!" << std::endl;
      });

    // Set "foo" and "bar" as conflicting options.
    ae.addConflictingOptions({ "foo", "bar" });

    // Parse the arguments and store possible error to variable error.
    Argengine::Error error;
    ae.parse(error);

    // Check error and print the possible error message.
    if (error.code != Argengine::Error::Code::Ok) {
        std::cerr << error.message << std::endl
                  << std::endl;
        ae.printHelp(); // Print the auto-generated help.
        return EXIT_FAILURE;
    }

    return EXIT_SUCCESS;
}